

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::reDim(SPxSolverBase<double> *this)

{
  int iVar1;
  int iVar2;
  pointer pUVar3;
  UpdateVector<double> *pUVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_30;
  
  iVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  iVar2 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  iVar6 = iVar1;
  if (iVar1 < iVar2) {
    iVar6 = iVar2;
  }
  if ((int)((ulong)((long)(this->unitVecs).data.
                          super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->unitVecs).data.
                         super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5) < iVar6) {
    std::vector<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>::
    resize(&(this->unitVecs).data,(long)iVar6);
    if (0 < iVar6) {
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      local_48 = &local_38;
      lVar7 = (long)iVar2;
      lVar8 = (long)iVar2 << 5;
      do {
        local_40 = 0x100000001;
        local_30 = (undefined4)(lVar7 + -1);
        local_38 = 0x3ff0000000000000;
        pUVar3 = (this->unitVecs).data.
                 super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((undefined8 **)((long)&pUVar3[-1].super_SVectorBase<double>.m_elem + lVar8) != &local_48
           ) {
          *(undefined4 *)((long)&pUVar3[-1].themem.idx + lVar8) = local_30;
          *(undefined8 *)((long)&pUVar3[-1].themem.val + lVar8) = 0x3ff0000000000000;
          *(undefined4 *)((long)&pUVar3[-1].super_SVectorBase<double>.memused + lVar8) = 1;
        }
        bVar5 = 1 < lVar7;
        lVar7 = lVar7 + -1;
        lVar8 = lVar8 + -0x20;
      } while (bVar5);
    }
  }
  if (this->initialized == true) {
    VectorBase<double>::reDim(this->theFrhs,(this->thecovectors->set).thenum,true);
    pUVar4 = this->theFvec;
    iVar1 = (this->thecovectors->set).thenum;
    VectorBase<double>::reDim(&pUVar4->super_VectorBase<double>,iVar1,true);
    SSVectorBase<double>::reDim(&pUVar4->thedelta,iVar1);
    pUVar4 = this->thePvec;
    iVar1 = (this->thevectors->set).thenum;
    VectorBase<double>::reDim(&pUVar4->super_VectorBase<double>,iVar1,true);
    SSVectorBase<double>::reDim(&pUVar4->thedelta,iVar1);
    VectorBase<double>::reDim(this->theCoPrhs,(this->thecovectors->set).thenum,true);
    pUVar4 = this->theCoPvec;
    iVar1 = (this->thecovectors->set).thenum;
    VectorBase<double>::reDim(&pUVar4->super_VectorBase<double>,iVar1,true);
    SSVectorBase<double>::reDim(&pUVar4->thedelta,iVar1);
    VectorBase<double>::reDim(&this->theTest,(this->thevectors->set).thenum,true);
    VectorBase<double>::reDim(&this->theCoTest,(this->thecovectors->set).thenum,true);
    VectorBase<double>::reDim
              (&this->theURbound,
               (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim
              (&this->theLRbound,
               (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim
              (&this->theUCbound,
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim
              (&this->theLCbound,
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum,true);
    VectorBase<double>::reDim(&this->theUBbound,(this->thecovectors->set).thenum,true);
    VectorBase<double>::reDim(&this->theLBbound,(this->thecovectors->set).thenum,true);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::reDim()
   {

      int newsize = SPxLPBase<R>::nCols() > SPxLPBase<R>::nRows() ? SPxLPBase<R>::nCols() :
                    SPxLPBase<R>::nRows();

      if(newsize > unitVecs.size())
      {
         unitVecs.reSize(newsize);

         while(newsize-- > 0)
            unitVecs[newsize] = UnitVectorBase<R>(newsize);
      }

      if(isInitialized())
      {
         theFrhs->reDim(dim());
         theFvec->reDim(dim());
         thePvec->reDim(coDim());

         theCoPrhs->reDim(dim());
         theCoPvec->reDim(dim());

         theTest.reDim(coDim());
         theCoTest.reDim(dim());

         theURbound.reDim(SPxLPBase<R>::nRows());
         theLRbound.reDim(SPxLPBase<R>::nRows());
         theUCbound.reDim(SPxLPBase<R>::nCols());
         theLCbound.reDim(SPxLPBase<R>::nCols());
         theUBbound.reDim(dim());
         theLBbound.reDim(dim());
      }
   }